

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O3

int32_t __thiscall
icu_63::PossibleWord::candidates
          (PossibleWord *this,UText *text,DictionaryMatcher *dict,int32_t rangeEnd)

{
  int iVar1;
  int64_t iVar2;
  int iVar3;
  
  iVar2 = utext_getNativeIndex_63(text);
  iVar3 = (int)iVar2;
  if (this->offset == iVar3) {
LAB_003145ec:
    iVar1 = this->count;
    if (iVar1 < 1) goto LAB_00314609;
  }
  else {
    this->offset = iVar3;
    iVar1 = (*dict->_vptr_DictionaryMatcher[2])
                      (dict,text,(ulong)(uint)(rangeEnd - iVar3),0x14,this->cuLengths,
                       this->cpLengths,0,&this->prefix);
    this->count = iVar1;
    if (iVar1 < 1) {
      utext_setNativeIndex_63(text,(long)iVar3);
      goto LAB_003145ec;
    }
  }
  utext_setNativeIndex_63(text,(long)iVar3 + (long)this->cuLengths[iVar1 - 1]);
  iVar1 = this->count;
LAB_00314609:
  this->current = iVar1 + -1;
  this->mark = iVar1 + -1;
  return iVar1;
}

Assistant:

int32_t PossibleWord::candidates( UText *text, DictionaryMatcher *dict, int32_t rangeEnd ) {
    // TODO: If getIndex is too slow, use offset < 0 and add discardAll()
    int32_t start = (int32_t)utext_getNativeIndex(text);
    if (start != offset) {
        offset = start;
        count = dict->matches(text, rangeEnd-start, UPRV_LENGTHOF(cuLengths), cuLengths, cpLengths, NULL, &prefix);
        // Dictionary leaves text after longest prefix, not longest word. Back up.
        if (count <= 0) {
            utext_setNativeIndex(text, start);
        }
    }
    if (count > 0) {
        utext_setNativeIndex(text, start+cuLengths[count-1]);
    }
    current = count-1;
    mark = current;
    return count;
}